

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stagewise_poly.cc
# Opt level: O3

void sort_data_update_support(stagewise_poly *poly)

{
  sparse_parameters *psVar1;
  sort_data *psVar2;
  ulong uVar3;
  float fVar4;
  example *peVar5;
  _func_void_weight_ptr_void_ptr *p_Var6;
  uint64_t uVar7;
  uint64_t uVar8;
  uint64_t *puVar9;
  undefined4 uVar10;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> _Var11;
  sort_data *psVar12;
  byte bVar13;
  float *pfVar14;
  long lVar15;
  ulong uVar16;
  uint32_t *puVar17;
  weight *pwVar18;
  vw *pvVar19;
  ulong uVar20;
  sort_data *psVar21;
  ulong uVar22;
  ulong uVar23;
  long lVar24;
  bool bVar25;
  float fVar26;
  weight wVar27;
  uint64_t index;
  ulong local_78;
  long local_70;
  sort_data *local_68;
  ulong local_60;
  float *local_58;
  uint64_t local_50;
  undefined1 local_48 [16];
  
  peVar5 = poly->original_ec;
  local_50 = (peVar5->super_example_predict).ft_offset;
  lVar24 = 0;
  (poly->synth_ec).super_example_predict.ft_offset = 0;
  (peVar5->super_example_predict).ft_offset = 0;
  fVar26 = powf((float)poly->sum_input_sparsity / (float)poly->num_examples,poly->sched_exponent);
  uVar22 = 1L << ((byte)poly->all->num_bits & 0x3f);
  uVar16 = (long)(fVar26 - 9.223372e+18) & (long)fVar26 >> 0x3f | (long)fVar26;
  if (uVar16 <= uVar22) {
    uVar22 = uVar16;
  }
  sort_data_ensure_sz(poly,uVar22);
  pvVar19 = poly->all;
  local_68 = poly->sd;
  local_70 = (long)(int)uVar22;
  do {
    bVar25 = (pvVar19->weights).sparse;
    puVar17 = &(pvVar19->weights).dense_weights._stride_shift;
    if (bVar25 != false) {
      puVar17 = &(pvVar19->weights).sparse_weights._stride_shift;
    }
    local_78 = (pvVar19->weights).sparse_weights._weight_mask;
    uVar22 = (pvVar19->weights).dense_weights._weight_mask;
    uVar16 = uVar22;
    if (bVar25 != false) {
      uVar16 = local_78;
    }
    bVar13 = (byte)*puVar17;
    uVar23 = lVar24 << (bVar13 & 0x3f);
    if (((poly->depthsbits
          [(((poly->synth_ec).super_example_predict.ft_offset + uVar23 & uVar16) >> (bVar13 & 0x3f))
           * 2 + 1] & 1) == 0) &&
       (uVar23 != ((ulong)pvVar19->wpp * 0xb1c55c << (bVar13 & 0x3f) & uVar16))) {
      if (bVar25 == false) {
        pwVar18 = (pvVar19->weights).dense_weights._begin + (uVar22 & uVar23);
        bVar13 = 0;
      }
      else {
        psVar1 = &(pvVar19->weights).sparse_weights;
        local_78 = local_78 & uVar23;
        _Var11._M_cur =
             (__node_type *)
             std::
             _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)psVar1,&local_78);
        if (_Var11._M_cur == (__node_type *)0x0) {
          local_58 = calloc_or_throw<float>
                               (1L << ((byte)(pvVar19->weights).sparse_weights._stride_shift & 0x3f)
                               );
          local_60 = local_78;
          std::
          _Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::_M_emplace<std::pair<unsigned_long,float*>>
                    ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)psVar1,&local_60);
          _Var11._M_cur =
               (__node_type *)
               std::
               _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)psVar1,&local_78);
          p_Var6 = (pvVar19->weights).sparse_weights.fun;
          if (p_Var6 != (_func_void_weight_ptr_void_ptr *)0x0) {
            (*p_Var6)(*(weight **)((long)_Var11._M_cur + 0x10),
                      (pvVar19->weights).sparse_weights.default_data);
          }
        }
        pwVar18 = *(weight **)
                   ((long)&((_Var11._M_cur)->
                           super__Hash_node_value<std::pair<const_unsigned_long,_float_*>,_false>).
                           super__Hash_node_value_base<std::pair<const_unsigned_long,_float_*>_>.
                           _M_storage._M_storage + 8);
        pvVar19 = poly->all;
        bVar13 = (pvVar19->weights).sparse;
      }
      wVar27 = *pwVar18;
      local_78 = pvVar19->normalized_idx + uVar23;
      if ((bVar13 & 1) == 0) {
        pfVar14 = (pvVar19->weights).dense_weights._begin +
                  (local_78 & (pvVar19->weights).dense_weights._weight_mask);
      }
      else {
        local_48 = ZEXT416((uint)wVar27);
        psVar1 = &(pvVar19->weights).sparse_weights;
        local_78 = local_78 & (pvVar19->weights).sparse_weights._weight_mask;
        _Var11._M_cur =
             (__node_type *)
             std::
             _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)psVar1,&local_78);
        if (_Var11._M_cur == (__node_type *)0x0) {
          local_58 = calloc_or_throw<float>
                               (1L << ((byte)(pvVar19->weights).sparse_weights._stride_shift & 0x3f)
                               );
          local_60 = local_78;
          std::
          _Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::_M_emplace<std::pair<unsigned_long,float*>>
                    ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)psVar1,&local_60);
          _Var11._M_cur =
               (__node_type *)
               std::
               _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)psVar1,&local_78);
          p_Var6 = (pvVar19->weights).sparse_weights.fun;
          if (p_Var6 != (_func_void_weight_ptr_void_ptr *)0x0) {
            (*p_Var6)(*(weight **)((long)_Var11._M_cur + 0x10),
                      (pvVar19->weights).sparse_weights.default_data);
          }
        }
        pfVar14 = *(float **)
                   ((long)&((_Var11._M_cur)->
                           super__Hash_node_value<std::pair<const_unsigned_long,_float_*>,_false>).
                           super__Hash_node_value_base<std::pair<const_unsigned_long,_float_*>_>.
                           _M_storage._M_storage + 8);
        wVar27 = (weight)local_48._0_4_;
      }
      fVar26 = ABS(wVar27) * *pfVar14;
      if (1e-09 < fVar26) {
        psVar12 = poly->sd;
        lVar15 = (long)local_68 - (long)psVar12 >> 4;
        if ((lVar15 == local_70) && (psVar12->weightsal <= fVar26 && fVar26 != psVar12->weightsal))
        {
          if (0x10 < (long)local_68 - (long)psVar12) {
            fVar4 = local_68[-1].weightsal;
            uVar7 = local_68[-1].wid;
            uVar10 = *(undefined4 *)&psVar12->field_0x4;
            uVar8 = psVar12->wid;
            local_68[-1].weightsal = psVar12->weightsal;
            *(undefined4 *)&local_68[-1].field_0x4 = uVar10;
            local_68[-1].wid = uVar8;
            uVar22 = (long)local_68 + (-0x10 - (long)psVar12);
            lVar15 = (long)uVar22 >> 4;
            if (lVar15 < 3) {
              uVar16 = 0;
            }
            else {
              uVar20 = 0;
              do {
                uVar16 = uVar20 * 2 + 2;
                uVar3 = uVar20 * 2 + 1;
                if (psVar12[uVar3].weightsal <= psVar12[uVar16].weightsal &&
                    psVar12[uVar16].weightsal != psVar12[uVar3].weightsal) {
                  uVar16 = uVar3;
                }
                psVar2 = psVar12 + uVar16;
                uVar10 = *(undefined4 *)&psVar2->field_0x4;
                uVar8 = psVar2->wid;
                psVar21 = psVar12 + uVar20;
                psVar21->weightsal = psVar2->weightsal;
                *(undefined4 *)&psVar21->field_0x4 = uVar10;
                psVar21->wid = uVar8;
                uVar20 = uVar16;
              } while ((long)uVar16 < (lVar15 - (lVar15 + -1 >> 0x3f)) + -1 >> 1);
            }
            uVar20 = uVar16;
            if (((uVar22 & 0x10) == 0) && (uVar16 == lVar15 + -2 >> 1)) {
              uVar20 = uVar16 * 2 + 1;
              psVar2 = psVar12 + uVar20;
              uVar10 = *(undefined4 *)&psVar2->field_0x4;
              uVar8 = psVar2->wid;
              psVar21 = psVar12 + uVar16;
              psVar21->weightsal = psVar2->weightsal;
              *(undefined4 *)&psVar21->field_0x4 = uVar10;
              psVar21->wid = uVar8;
            }
            if (0 < (long)uVar20) {
              do {
                uVar22 = uVar20 - 1;
                uVar16 = uVar22 >> 1;
                if (psVar12[uVar16].weightsal <= fVar4) goto LAB_001cbe3d;
                psVar21 = psVar12 + uVar16;
                uVar10 = *(undefined4 *)&psVar21->field_0x4;
                uVar8 = psVar21->wid;
                psVar2 = psVar12 + uVar20;
                psVar2->weightsal = psVar21->weightsal;
                *(undefined4 *)&psVar2->field_0x4 = uVar10;
                psVar2->wid = uVar8;
                uVar20 = uVar16;
              } while (1 < uVar22);
              uVar20 = 0;
            }
LAB_001cbe3d:
            psVar12[uVar20].weightsal = fVar4;
            psVar12[uVar20].wid = uVar7;
            psVar12 = poly->sd;
          }
          local_68 = local_68 + -1;
          lVar15 = (long)local_68 - (long)psVar12 >> 4;
        }
        if (lVar15 < local_70) {
          local_68->weightsal = fVar26;
          local_68->wid = uVar23;
          local_68 = local_68 + 1;
          psVar12 = poly->sd;
          lVar15 = (long)local_68 - (long)psVar12 >> 4;
          uVar22 = lVar15 - 1;
          if (1 < lVar15) {
            do {
              uVar16 = uVar22 - 1;
              uVar20 = uVar16 >> 1;
              if (psVar12[uVar20].weightsal <= fVar26) goto LAB_001cbebe;
              psVar21 = psVar12 + uVar20;
              uVar10 = *(undefined4 *)&psVar21->field_0x4;
              uVar7 = psVar21->wid;
              psVar2 = psVar12 + uVar22;
              psVar2->weightsal = psVar21->weightsal;
              *(undefined4 *)&psVar2->field_0x4 = uVar10;
              psVar2->wid = uVar7;
              uVar22 = uVar20;
            } while (1 < uVar16);
            uVar22 = 0;
          }
LAB_001cbebe:
          psVar12[uVar22].weightsal = fVar26;
          psVar12[uVar22].wid = uVar23;
        }
      }
    }
    lVar24 = lVar24 + 1;
    pvVar19 = poly->all;
  } while (lVar24 != 1L << ((byte)pvVar19->num_bits & 0x3f));
  lVar24 = (long)local_68 - (long)poly->sd;
  if ((lVar24 != 0) && (poly->sd_len != 0)) {
    lVar15 = 8;
    uVar22 = 1;
    do {
      pvVar19 = poly->all;
      puVar17 = &(pvVar19->weights).dense_weights._stride_shift;
      puVar9 = &(pvVar19->weights).dense_weights._weight_mask;
      if ((pvVar19->weights).sparse != false) {
        puVar17 = &(pvVar19->weights).sparse_weights._stride_shift;
        puVar9 = &(pvVar19->weights).sparse_weights._weight_mask;
      }
      poly->depthsbits
      [(((poly->synth_ec).super_example_predict.ft_offset +
         *(long *)((long)&poly->sd->weightsal + lVar15) & *puVar9) >> ((byte)*puVar17 & 0x3f)) * 2 +
       1] = poly->depthsbits
            [(((poly->synth_ec).super_example_predict.ft_offset +
               *(long *)((long)&poly->sd->weightsal + lVar15) & *puVar9) >> ((byte)*puVar17 & 0x3f))
             * 2 + 1] ^ 1;
      if ((ulong)(lVar24 >> 4) <= uVar22) break;
      lVar15 = lVar15 + 0x10;
      bVar25 = uVar22 < poly->sd_len;
      uVar22 = uVar22 + 1;
    } while (bVar25);
  }
  (poly->original_ec->super_example_predict).ft_offset = local_50;
  (poly->synth_ec).super_example_predict.ft_offset = local_50;
  return;
}

Assistant:

void sort_data_update_support(stagewise_poly &poly)
{
  assert(poly.num_examples);

  // ft_offset affects parent_set / parent_get.  This state must be reset at end.
  uint64_t pop_ft_offset = poly.original_ec->ft_offset;
  poly.synth_ec.ft_offset = 0;
  assert(poly.original_ec);
  poly.original_ec->ft_offset = 0;

  size_t num_new_features = (size_t)pow(poly.sum_input_sparsity * 1.0f / poly.num_examples, poly.sched_exponent);
  num_new_features = (num_new_features > poly.all->length()) ? (uint64_t)poly.all->length() : num_new_features;
  sort_data_ensure_sz(poly, num_new_features);

  sort_data *heap_end = poly.sd;
  make_heap(poly.sd, heap_end, sort_data_compar_heap);  // redundant
  for (uint64_t i = 0; i != poly.all->length(); ++i)
  {
    uint64_t wid = stride_shift(poly, i);
    if (!parent_get(poly, wid) && wid != constant_feat_masked(poly))
    {
      float weightsal = (fabsf(poly.all->weights[wid]) * poly.all->weights[poly.all->normalized_idx + (wid)]);
      /*
       * here's some depth penalization code.  It was found to not improve
       * statistical performance, and meanwhile it is verified as giving
       * a nontrivial computational hit, thus commented out.
       *
       * - poly.magic_argument
       * sqrtf(min_depths_get(poly, stride_shift(poly, i)) * 1.0 / poly.num_examples)
       */
      ;
      if (weightsal > tolerance)
      {
        assert(heap_end >= poly.sd);
        assert(heap_end <= poly.sd + num_new_features);

        if (heap_end - poly.sd == (int)num_new_features && poly.sd->weightsal < weightsal)
        {
          pop_heap(poly.sd, heap_end, sort_data_compar_heap);
          --heap_end;
        }

        assert(heap_end >= poly.sd);
        assert(heap_end < poly.sd + poly.sd_len);

        if (heap_end - poly.sd < (int)num_new_features)
        {
          heap_end->weightsal = weightsal;
          heap_end->wid = wid;
          ++heap_end;
          push_heap(poly.sd, heap_end, sort_data_compar_heap);
        }
      }
    }
  }
  num_new_features = (uint64_t)(heap_end - poly.sd);

#ifdef DEBUG
  // eyeballing weights a pain if unsorted.
  qsort(poly.sd, num_new_features, sizeof(sort_data), sort_data_compar);
#endif  // DEBUG

  for (uint64_t pos = 0; pos < num_new_features && pos < poly.sd_len; ++pos)
  {
    assert(!parent_get(poly, poly.sd[pos].wid) && poly.sd[pos].weightsal > tolerance &&
        poly.sd[pos].wid != constant_feat_masked(poly));
    parent_toggle(poly, poly.sd[pos].wid);
#ifdef DEBUG
    cout << "Adding feature " << pos << "/" << num_new_features << " || wid " << poly.sd[pos].wid << " || sort value "
         << poly.sd[pos].weightsal << endl;
#endif  // DEBUG
  }

#ifdef DEBUG
  cout << "depths:";
  for (uint64_t depth = 0; depth <= poly.max_depth && depth < sizeof(poly.depths) / sizeof(*poly.depths); ++depth)
    cout << "  [" << depth << "] = " << poly.depths[depth];
  cout << endl;

  cout << "Sanity check after sort... " << flush;
  sanity_check_state(poly);
  cout << "done" << endl;
#endif  // DEBUG

  // it's okay that these may have been initially unequal; synth_ec value irrelevant so far.
  poly.original_ec->ft_offset = pop_ft_offset;
  poly.synth_ec.ft_offset = pop_ft_offset;
}